

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::FieldDescriptorProto::SharedDtor(MessageLite *self)

{
  MessageLite *self_00;
  ulong uVar1;
  undefined8 extraout_RAX;
  
  if (((self->_internal_metadata_).ptr_ & 1) != 0) {
    internal::InternalMetadata::DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>
              (&self->_internal_metadata_);
  }
  uVar1 = (self->_internal_metadata_).ptr_;
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[1]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 2));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[2]._internal_metadata_);
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)(self + 3));
    internal::ArenaStringPtr::Destroy((ArenaStringPtr *)&self[3]._internal_metadata_);
    self_00 = (MessageLite *)self[4]._vptr_MessageLite;
    if (self_00 != (MessageLite *)0x0) {
      FieldOptions::SharedDtor(self_00);
      operator_delete(self_00,0x98);
      return;
    }
    return;
  }
  SharedDtor((FieldDescriptorProto *)&stack0xffffffffffffffe0);
  __clang_call_terminate(extraout_RAX);
}

Assistant:

inline void FieldDescriptorProto::SharedDtor(MessageLite& self) {
  FieldDescriptorProto& this_ = static_cast<FieldDescriptorProto&>(self);
  this_._internal_metadata_.Delete<::google::protobuf::UnknownFieldSet>();
  ABSL_DCHECK(this_.GetArena() == nullptr);
  this_._impl_.name_.Destroy();
  this_._impl_.extendee_.Destroy();
  this_._impl_.type_name_.Destroy();
  this_._impl_.default_value_.Destroy();
  this_._impl_.json_name_.Destroy();
  delete this_._impl_.options_;
  this_._impl_.~Impl_();
}